

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * rbuObjIterGetOldlist(sqlite3rbu *p,RbuObjIter *pIter,char *zObj)

{
  char *zCol;
  char *pcStack_30;
  int i;
  char *zS;
  char *zList;
  char *zObj_local;
  RbuObjIter *pIter_local;
  sqlite3rbu *p_local;
  
  zS = (char *)0x0;
  if ((p->rc == 0) && (pIter->abIndexed != (u8 *)0x0)) {
    pcStack_30 = "";
    for (zCol._4_4_ = 0; zCol._4_4_ < pIter->nTblCol; zCol._4_4_ = zCol._4_4_ + 1) {
      if (pIter->abIndexed[zCol._4_4_] == '\0') {
        zS = sqlite3_mprintf("%z%sNULL",zS,pcStack_30);
      }
      else {
        zS = sqlite3_mprintf("%z%s%s.\"%w\"",zS,pcStack_30,zObj,pIter->azTblCol[zCol._4_4_]);
      }
      pcStack_30 = ", ";
      if (zS == (char *)0x0) {
        p->rc = 7;
        break;
      }
    }
    if ((pIter->eType == 3) || (pIter->eType == 1)) {
      zS = rbuMPrintf(p,"%z, %s._rowid_",zS,zObj);
    }
  }
  return zS;
}

Assistant:

static char *rbuObjIterGetOldlist(
  sqlite3rbu *p, 
  RbuObjIter *pIter,
  const char *zObj
){
  char *zList = 0;
  if( p->rc==SQLITE_OK && pIter->abIndexed ){
    const char *zS = "";
    int i;
    for(i=0; i<pIter->nTblCol; i++){
      if( pIter->abIndexed[i] ){
        const char *zCol = pIter->azTblCol[i];
        zList = sqlite3_mprintf("%z%s%s.\"%w\"", zList, zS, zObj, zCol);
      }else{
        zList = sqlite3_mprintf("%z%sNULL", zList, zS);
      }
      zS = ", ";
      if( zList==0 ){
        p->rc = SQLITE_NOMEM;
        break;
      }
    }

    /* For a table with implicit rowids, append "old._rowid_" to the list. */
    if( pIter->eType==RBU_PK_EXTERNAL || pIter->eType==RBU_PK_NONE ){
      zList = rbuMPrintf(p, "%z, %s._rowid_", zList, zObj);
    }
  }
  return zList;
}